

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O0

uint8_t * AC3Codec::findFrame(uint8_t *buffer,uint8_t *end)

{
  uint8_t *local_28;
  uint8_t *curBuf;
  uint8_t *end_local;
  uint8_t *buffer_local;
  
  local_28 = buffer;
  if (buffer != (uint8_t *)0x0) {
    for (; local_28 < end + -1; local_28 = local_28 + 1) {
      if ((*local_28 == '\v') && (local_28[1] == 'w')) {
        return local_28;
      }
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *AC3Codec::findFrame(uint8_t *buffer, const uint8_t *end)
{
    if (buffer == nullptr)
        return nullptr;
    uint8_t *curBuf = buffer;
    while (curBuf < end - 1)
    {
        if (*curBuf == 0x0B && curBuf[1] == 0x77)
            return curBuf;
        curBuf++;
    }
    return nullptr;
}